

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall soplex::SoPlexBase<double>::_storeBasis(SoPlexBase<double> *this)

{
  if (this->_hasBasis == true) {
    this->_storedBasis = true;
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->_storedBasisStatusCols,(this->_basisStatusCols).thesize);
    memcpy((this->_storedBasisStatusCols).data,(this->_basisStatusCols).data,
           (ulong)(uint)(this->_storedBasisStatusCols).thesize << 2);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->_storedBasisStatusRows,(this->_basisStatusRows).thesize);
    memcpy((this->_storedBasisStatusRows).data,(this->_basisStatusRows).data,
           (ulong)(uint)(this->_storedBasisStatusRows).thesize << 2);
    return;
  }
  this->_storedBasis = false;
  return;
}

Assistant:

void SoPlexBase<R>::_storeBasis()
{
   assert(!_storedBasis);

   if(_hasBasis)
   {
      _storedBasis = true;
      _storedBasisStatusCols = _basisStatusCols;
      _storedBasisStatusRows = _basisStatusRows;
   }
   else
      _storedBasis = false;
}